

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

string * __thiscall
cmUuid::ByteToHex_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar byte)

{
  char __lhs;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = true;
  do {
    bVar3 = bVar1;
    bVar2 = byte & 0xf;
    __lhs = bVar2 + 0x57;
    if (bVar2 < 10) {
      __lhs = bVar2 + 0x30;
    }
    std::operator+(&local_50,__lhs,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    byte = byte >> 4;
    bVar1 = false;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::ByteToHex(unsigned char byte) const
{
  std::string result;
  for(int i = 0; i < 2; ++i)
    {
    unsigned char rest = byte % 16;
    byte /= 16;

    char c = (rest < 0xA) ?
      char('0' + rest) :
      char('a' + (rest - 0xA));

    result = c + result;
    }

  return result;
}